

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_set(ggml_compute_params *params,ggml_tensor *dst)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  void *pvVar7;
  void *pvVar8;
  int64_t iVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [24];
  char cVar17;
  int iVar18;
  int iVar19;
  size_t sVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  char *pcVar24;
  long lVar25;
  undefined8 uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  
  pgVar5 = dst->src[0];
  if (pgVar5->type == GGML_TYPE_I32) {
    pgVar6 = dst->src[1];
    cVar17 = ggml_are_same_shape(pgVar5,dst);
    if (cVar17 == '\0') {
      pcVar24 = "ggml_are_same_shape(src0, dst)";
      uVar26 = 0xf8a;
    }
    else {
      cVar17 = ggml_is_contiguous(dst);
      if ((cVar17 == '\0') || (cVar17 = ggml_is_contiguous(pgVar5), cVar17 == '\0')) {
        pcVar24 = "ggml_is_contiguous(dst) && ggml_is_contiguous(src0)";
        uVar26 = 0xf8b;
      }
      else {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)dst->op_params;
        auVar14 = vpmovsxdq_avx(auVar14);
        iVar2 = dst->op_params[2];
        iVar3 = dst->op_params[3];
        if (dst->op_params[4] == 0) {
          if (params->ith == 0) {
            pvVar7 = dst->data;
            pvVar8 = pgVar5->data;
            sVar20 = ggml_nbytes(dst);
            memcpy(pvVar7,pvVar8,sVar20);
          }
          ggml_barrier(params->threadpool);
        }
        iVar4 = params->ith;
        iVar19 = params->nth;
        iVar18 = ggml_nrows(pgVar6);
        iVar9 = pgVar6->ne[0];
        sVar10 = pgVar6->nb[0];
        sVar11 = pgVar6->nb[1];
        sVar12 = pgVar6->nb[2];
        sVar13 = pgVar6->nb[3];
        auVar16 = *(undefined1 (*) [24])pgVar6->ne;
        auVar32 = *(undefined1 (*) [32])pgVar6->ne;
        uVar21 = ggml_element_size(pgVar5);
        auVar36._8_56_ = extraout_var_00;
        auVar36._0_8_ = extraout_XMM1_Qa_00;
        auVar34._8_8_ = 1;
        auVar34._0_8_ = 1;
        auVar34._16_8_ = 1;
        auVar34._24_8_ = 1;
        auVar32 = vpmaxuq_avx512vl(auVar32,auVar34);
        auVar34 = vpcmpeqd_avx2(auVar36._0_32_,auVar36._0_32_);
        auVar34 = vpaddq_avx2(auVar32,auVar34);
        auVar34 = vpsllq_avx2(auVar34,0x20);
        auVar32 = vpsraq_avx512vl(auVar34,0x20);
        auVar34 = vpermq_avx2(ZEXT1632(auVar14),0xd0);
        auVar34 = vpblendd_avx2(auVar34,ZEXT832(uVar21),3);
        auVar33 = vpbroadcastq_avx512vl();
        auVar34 = vpblendd_avx2(auVar34,auVar33,0xc0);
        auVar34 = vpmullq_avx512vl(auVar34,auVar32);
        auVar1 = vpaddq_avx(auVar34._0_16_,auVar34._16_16_);
        auVar15 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddq_avx(auVar1,auVar15);
        uVar21 = ggml_nbytes(dst);
        if (uVar21 < (ulong)(auVar1._0_8_ + (long)iVar3)) {
          pcVar24 = "offset + im0*nb0 + im1*nb1 + im2*nb2 + im3*nb3 <= ggml_nbytes(dst)";
          uVar26 = 0xfb2;
        }
        else {
          if (sVar10 == 4) {
            iVar19 = (iVar19 + -1 + iVar18) / iVar19;
            lVar30 = (long)iVar4 * (long)iVar19;
            iVar19 = iVar19 + (int)lVar30;
            if (iVar18 <= iVar19) {
              iVar19 = iVar18;
            }
            if (iVar19 <= (int)lVar30) {
              return;
            }
            lVar23 = vpextrq_avx(auVar16._0_16_,1);
            lVar25 = auVar16._16_8_ * lVar23;
            pvVar7 = pgVar6->data;
            uVar27 = (uint)iVar9;
            lVar28 = vpextrq_avx(auVar14,1);
            pvVar8 = dst->data;
            do {
              lVar31 = (long)(int)(lVar30 / lVar25);
              lVar22 = lVar30 - lVar31 * lVar25;
              if (0 < (int)uVar27) {
                lVar29 = (long)(int)(lVar22 / lVar23);
                lVar22 = (long)(int)(lVar22 % lVar23);
                uVar21 = 0;
                do {
                  *(undefined4 *)
                   ((long)pvVar8 +
                   uVar21 * 4 +
                   lVar22 * auVar14._0_8_ + lVar29 * lVar28 + lVar31 * iVar2 + (long)iVar3) =
                       *(undefined4 *)
                        ((long)pvVar7 +
                        uVar21 * 4 + lVar29 * sVar12 + lVar22 * sVar11 + lVar31 * sVar13);
                  uVar21 = uVar21 + 1;
                } while ((uVar27 & 0x7fffffff) != uVar21);
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != iVar19);
            return;
          }
          pcVar24 = "nb10 == sizeof(int32_t)";
          uVar26 = 0xfb4;
        }
      }
    }
  }
  else {
    if (pgVar5->type != GGML_TYPE_F32) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0xff3,"fatal error");
    }
    pgVar6 = dst->src[1];
    cVar17 = ggml_are_same_shape(pgVar5,dst);
    if (cVar17 == '\0') {
      pcVar24 = "ggml_are_same_shape(src0, dst)";
      uVar26 = 0xf43;
    }
    else {
      cVar17 = ggml_is_contiguous(dst);
      if ((cVar17 == '\0') || (cVar17 = ggml_is_contiguous(pgVar5), cVar17 == '\0')) {
        pcVar24 = "ggml_is_contiguous(dst) && ggml_is_contiguous(src0)";
        uVar26 = 0xf44;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)dst->op_params;
        auVar14 = vpmovsxdq_avx(auVar1);
        iVar2 = dst->op_params[2];
        iVar3 = dst->op_params[3];
        if (dst->op_params[4] == 0) {
          if (params->ith == 0) {
            pvVar7 = dst->data;
            pvVar8 = pgVar5->data;
            sVar20 = ggml_nbytes(dst);
            memcpy(pvVar7,pvVar8,sVar20);
          }
          ggml_barrier(params->threadpool);
        }
        iVar4 = params->ith;
        iVar19 = params->nth;
        iVar18 = ggml_nrows(pgVar6);
        iVar9 = pgVar6->ne[0];
        sVar10 = pgVar6->nb[0];
        sVar11 = pgVar6->nb[1];
        sVar12 = pgVar6->nb[2];
        sVar13 = pgVar6->nb[3];
        auVar16 = *(undefined1 (*) [24])pgVar6->ne;
        auVar34 = *(undefined1 (*) [32])pgVar6->ne;
        uVar21 = ggml_element_size(pgVar5);
        auVar35._8_56_ = extraout_var;
        auVar35._0_8_ = extraout_XMM1_Qa;
        auVar32._8_8_ = 1;
        auVar32._0_8_ = 1;
        auVar32._16_8_ = 1;
        auVar32._24_8_ = 1;
        auVar32 = vpmaxuq_avx512vl(auVar34,auVar32);
        auVar34 = vpcmpeqd_avx2(auVar35._0_32_,auVar35._0_32_);
        auVar34 = vpaddq_avx2(auVar32,auVar34);
        auVar34 = vpsllq_avx2(auVar34,0x20);
        auVar32 = vpsraq_avx512vl(auVar34,0x20);
        auVar34 = vpermq_avx2(ZEXT1632(auVar14),0xd0);
        auVar34 = vpblendd_avx2(auVar34,ZEXT832(uVar21),3);
        auVar33 = vpbroadcastq_avx512vl();
        auVar34 = vpblendd_avx2(auVar34,auVar33,0xc0);
        auVar34 = vpmullq_avx512vl(auVar34,auVar32);
        auVar1 = vpaddq_avx(auVar34._0_16_,auVar34._16_16_);
        auVar15 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddq_avx(auVar1,auVar15);
        uVar21 = ggml_nbytes(dst);
        if (uVar21 < (ulong)(auVar1._0_8_ + (long)iVar3)) {
          pcVar24 = "offset + im0*nb0 + im1*nb1 + im2*nb2 + im3*nb3 <= ggml_nbytes(dst)";
          uVar26 = 0xf6b;
        }
        else {
          if (sVar10 == 4) {
            iVar19 = (iVar19 + -1 + iVar18) / iVar19;
            lVar30 = (long)iVar4 * (long)iVar19;
            iVar19 = iVar19 + (int)lVar30;
            if (iVar18 <= iVar19) {
              iVar19 = iVar18;
            }
            if ((int)lVar30 < iVar19) {
              lVar23 = vpextrq_avx(auVar16._0_16_,1);
              lVar25 = auVar16._16_8_ * lVar23;
              pvVar7 = pgVar6->data;
              uVar27 = (uint)iVar9;
              lVar28 = vpextrq_avx(auVar14,1);
              pvVar8 = dst->data;
              do {
                lVar31 = (long)(int)(lVar30 / lVar25);
                lVar22 = lVar30 - lVar31 * lVar25;
                if (0 < (int)uVar27) {
                  lVar29 = (long)(int)(lVar22 / lVar23);
                  lVar22 = (long)(int)(lVar22 % lVar23);
                  uVar21 = 0;
                  do {
                    *(undefined4 *)
                     ((long)pvVar8 +
                     uVar21 * 4 +
                     lVar22 * auVar14._0_8_ + lVar29 * lVar28 + lVar31 * iVar2 + (long)iVar3) =
                         *(undefined4 *)
                          ((long)pvVar7 +
                          uVar21 * 4 + lVar29 * sVar12 + lVar22 * sVar11 + lVar31 * sVar13);
                    uVar21 = uVar21 + 1;
                  } while ((uVar27 & 0x7fffffff) != uVar21);
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 != iVar19);
            }
            return;
          }
          pcVar24 = "nb10 == sizeof(float)";
          uVar26 = 0xf6d;
        }
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar26,"GGML_ASSERT(%s) failed",pcVar24);
}

Assistant:

void ggml_compute_forward_set(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_set_f32(params, dst);
            } break;
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_set_i32(params, dst);
            } break;
        case GGML_TYPE_F16:
        case GGML_TYPE_BF16:
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q8_1:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}